

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O1

double ComputeRecall(uint32_t num,int K,int *gt,
                    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                    *points)

{
  pointer pvVar1;
  pointer ppVar2;
  size_type sVar3;
  pair<unsigned_int,_float> *p;
  pointer __x;
  ulong uVar4;
  int iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> label;
  ulong local_90;
  uint local_7c;
  long local_78;
  ulong local_70;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *local_68;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  auVar7 = in_ZMM1._0_16_;
  if (num == 0) {
    dVar6 = 0.0;
  }
  else {
    local_70 = (ulong)num;
    local_78 = (long)K << 2;
    iVar5 = 0;
    local_90 = 0;
    local_68 = points;
    do {
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < K) {
        uVar4 = 0;
        do {
          local_7c = gt[uVar4];
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(&local_60,&local_7c);
          uVar4 = uVar4 + 1;
        } while ((uint)K != uVar4);
      }
      pvVar1 = (local_68->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = *(pointer *)
                ((long)&pvVar1[local_90].
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      for (__x = pvVar1[local_90].
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __x != ppVar2; __x = __x + 1) {
        sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      &local_60,&__x->first);
        iVar5 = (iVar5 + 1) - (uint)(sVar3 == 0);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_60);
      auVar7 = in_ZMM1._0_16_;
      local_90 = local_90 + 1;
      gt = (int *)((long)gt + local_78);
    } while (local_90 != local_70);
    dVar6 = (double)iVar5;
  }
  auVar7 = vcvtusi2sd_avx512f(auVar7,K * num);
  return dVar6 / auVar7._0_8_;
}

Assistant:

double ComputeRecall(uint32_t num, int K, const int *gt, const std::vector<PointSet> &points) {
  int recalls = 0;
  for (size_t i = 0; i < num; i++) {
    std::set<uint32_t> label;
    for (int j = 0; j < K; j++) {
      label.insert(gt[i * K + j]);
    }
    for (const auto &p : points[i]) {
      if (label.count(p.first) != 0) {
        recalls += 1;
      }
    }
  }

  return 1.0 * recalls / (num * K);
}